

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O3

int32_t uprv_swapArray32(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                        UErrorCode *pErrorCode)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       ((length & 3U) != 0 || outData == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
    if (length != 0) {
      uVar2 = ((uint)length >> 2) + 1;
      lVar3 = 0;
      do {
        uVar1 = *(uint *)((long)inData + lVar3);
        *(uint *)((long)outData + lVar3) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar2 = uVar2 - 1;
        lVar3 = lVar3 + 4;
      } while (1 < uVar2);
      return length;
    }
  }
  return 0;
}

Assistant:

static int32_t U_CALLCONV
uprv_swapArray32(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const uint32_t *p;
    uint32_t *q;
    int32_t count;
    uint32_t x;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length&3)!=0 || outData==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    p=(const uint32_t *)inData;
    q=(uint32_t *)outData;
    count=length/4;
    while(count>0) {
        x=*p++;
        *q++=(uint32_t)((x<<24)|((x<<8)&0xff0000)|((x>>8)&0xff00)|(x>>24));
        --count;
    }

    return length;
}